

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppTest.cpp
# Opt level: O0

void __thiscall TApp_FileExists_Test::TestBody(TApp_FileExists_Test *this)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool bVar1;
  char *pcVar2;
  Option *this_00;
  undefined8 uVar3;
  long *plVar4;
  char *in_R9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_500;
  string local_4a0;
  AssertHelper local_480;
  Message local_478;
  string local_470;
  bool local_449;
  undefined1 local_448 [8];
  AssertionResult gtest_ar__2;
  Message local_430;
  undefined1 local_428 [8];
  AssertionResult gtest_ar;
  AssertHelper local_3f8;
  Message local_3f0;
  undefined1 local_3e8 [8];
  AssertionResult gtest_ar__1;
  bool local_1d1;
  bool ok;
  Message local_1c8 [2];
  ValidationError *anon_var_0;
  char *pcStack_1b0;
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  string local_178 [32];
  iterator local_158;
  size_type local_150;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_148;
  allocator local_121;
  string local_120;
  allocator local_f9;
  string local_f8;
  allocator local_d1;
  undefined1 local_d0 [8];
  string filename;
  AssertHelper local_90;
  Message local_88;
  string local_80;
  bool local_59;
  undefined1 local_58 [8];
  AssertionResult gtest_ar_;
  allocator local_31;
  undefined1 local_30 [8];
  string myfile;
  TApp_FileExists_Test *this_local;
  
  myfile.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_30,"TestNonFileNotUsed.txt",&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  CLI::ExistingFile(&local_80,(string *)local_30);
  local_59 = (bool)std::__cxx11::string::empty();
  local_59 = (bool)(local_59 ^ 1);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_58,&local_59,(type *)0x0)
  ;
  std::__cxx11::string::~string((string *)&local_80);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_58);
  if (!bVar1) {
    testing::Message::Message(&local_88);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)((long)&filename.field_2 + 8),(internal *)local_58,
               (AssertionResult *)"CLI::ExistingFile(myfile).empty()","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
               ,0x303,pcVar2);
    testing::internal::AssertHelper::operator=(&local_90,&local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    std::__cxx11::string::~string((string *)(filename.field_2._M_local_buf + 8));
    testing::Message::~Message(&local_88);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_58);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_d0,"Failed",&local_d1);
  std::allocator<char>::~allocator((allocator<char> *)&local_d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_f8,"--file",&local_f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_120,"",&local_121);
  this_00 = CLI::App::
            add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
                      (&(this->super_TApp).app,&local_f8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0
                       ,&local_120);
  std::function<std::__cxx11::string(std::__cxx11::string_const&)>::
  function<std::__cxx11::string(&)(std::__cxx11::string_const&),void>
            ((function<std::__cxx11::string(std::__cxx11::string_const&)> *)&local_148,
             CLI::ExistingFile);
  CLI::Option::check(this_00,&local_148);
  CLI::std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_148);
  std::__cxx11::string::~string((string *)&local_120);
  std::allocator<char>::~allocator((allocator<char> *)&local_121);
  std::__cxx11::string::~string((string *)&local_f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_f9);
  gtest_msg.value._6_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_198,"--file",(allocator *)((long)&gtest_msg.value + 7));
  std::__cxx11::string::string(local_178,(string *)local_30);
  gtest_msg.value._6_1_ = 0;
  local_158 = &local_198;
  local_150 = 2;
  __l._M_len = 2;
  __l._M_array = local_158;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->super_TApp).args,__l);
  local_500 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_158;
  do {
    local_500 = local_500 + -1;
    std::__cxx11::string::~string((string *)local_500);
  } while (local_500 != &local_198);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_msg.value + 7));
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xfffffffffffffe50,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xfffffffffffffe50);
  if (bVar1) {
    anon_var_0._7_1_ = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      TApp::run(&this->super_TApp);
    }
    if ((anon_var_0._7_1_ & 1) != 0) goto LAB_0013af14;
    pcStack_1b0 = 
    "Expected: run() throws an exception of type CLI::ValidationError.\n  Actual: it throws nothing."
    ;
  }
  testing::Message::Message(local_1c8);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&stack0xfffffffffffffe30,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
             ,0x309,pcStack_1b0);
  testing::internal::AssertHelper::operator=((AssertHelper *)&stack0xfffffffffffffe30,local_1c8);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffe30);
  testing::Message::~Message(local_1c8);
LAB_0013af14:
  CLI::App::reset(&(this->super_TApp).app);
  uVar3 = std::__cxx11::string::c_str();
  std::ofstream::ofstream(&gtest_ar__1.message_,uVar3,0x10);
  plVar4 = (long *)std::ostream::put((char)&gtest_ar__1 + '\b');
  bVar1 = std::ios::operator_cast_to_bool((ios *)((long)plVar4 + *(long *)(*plVar4 + -0x18)));
  std::ofstream::~ofstream(&gtest_ar__1.message_);
  local_1d1 = bVar1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_3e8,&local_1d1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3e8);
  if (!bVar1) {
    testing::Message::Message(&local_3f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar.message_,(internal *)local_3e8,(AssertionResult *)"ok","false",
               "true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_3f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
               ,0x30e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_3f8,&local_3f0);
    testing::internal::AssertHelper::~AssertHelper(&local_3f8);
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    testing::Message::~Message(&local_3f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3e8);
  TApp::run(&this->super_TApp);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((EqHelper<false> *)local_428,"myfile","filename",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_428);
  if (!bVar1) {
    testing::Message::Message(&local_430);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_428);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
               ,0x310,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__2.message_,&local_430);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__2.message_);
    testing::Message::~Message(&local_430);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_428);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  remove(pcVar2);
  CLI::ExistingFile(&local_470,(string *)local_30);
  local_449 = (bool)std::__cxx11::string::empty();
  local_449 = (bool)(local_449 ^ 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_448,&local_449,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_470);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_448);
  if (!bVar1) {
    testing::Message::Message(&local_478);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_4a0,(internal *)local_448,
               (AssertionResult *)"CLI::ExistingFile(myfile).empty()","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_480,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
               ,0x313,pcVar2);
    testing::internal::AssertHelper::operator=(&local_480,&local_478);
    testing::internal::AssertHelper::~AssertHelper(&local_480);
    std::__cxx11::string::~string((string *)&local_4a0);
    testing::Message::~Message(&local_478);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_448);
  std::__cxx11::string::~string((string *)local_d0);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

TEST_F(TApp, FileExists) {
    std::string myfile{"TestNonFileNotUsed.txt"};
    EXPECT_FALSE(CLI::ExistingFile(myfile).empty());

    std::string filename = "Failed";
    app.add_option("--file", filename)->check(CLI::ExistingFile);
    args = {"--file", myfile};

    EXPECT_THROW(run(), CLI::ValidationError);

    app.reset();

    bool ok = static_cast<bool>(std::ofstream(myfile.c_str()).put('a')); // create file
    EXPECT_TRUE(ok);
    run();
    EXPECT_EQ(myfile, filename);

    std::remove(myfile.c_str());
    EXPECT_FALSE(CLI::ExistingFile(myfile).empty());
}